

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O0

lzma_ret block_encode(lzma_coder_conflict12 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  anon_enum_32_conflict1 aVar1;
  size_t sVar2;
  size_t sVar3;
  lzma_ret lVar4;
  uint32_t uVar5;
  size_t size;
  ulong in_size_00;
  bool bVar6;
  size_t check_size;
  size_t out_used;
  size_t in_used;
  lzma_ret ret;
  size_t out_start;
  size_t in_start;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict12 *coder_local;
  
  if (0x7fffffffffffffff - coder->uncompressed_size < in_size - *in_pos) {
    return LZMA_DATA_ERROR;
  }
  aVar1 = coder->sequence;
  if (aVar1 == SEQ_CODE) {
    sVar2 = *in_pos;
    sVar3 = *out_pos;
    lVar4 = (*(coder->next).code)
                      ((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    size = *in_pos - sVar2;
    if (0x7ffffffffffffbbc - coder->compressed_size < *out_pos - sVar3) {
      return LZMA_DATA_ERROR;
    }
    coder->compressed_size = (*out_pos - sVar3) + coder->compressed_size;
    coder->uncompressed_size = size + coder->uncompressed_size;
    lzma_check_update(&coder->check,coder->block->check,in + sVar2,size);
    if (lVar4 != LZMA_STREAM_END) {
      return lVar4;
    }
    if (action == LZMA_SYNC_FLUSH) {
      return LZMA_STREAM_END;
    }
    if (*in_pos != in_size) {
      __assert_fail("*in_pos == in_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x54,
                    "lzma_ret block_encode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (action != LZMA_FINISH) {
      __assert_fail("action == LZMA_FINISH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x55,
                    "lzma_ret block_encode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    coder->block->compressed_size = coder->compressed_size;
    coder->block->uncompressed_size = coder->uncompressed_size;
    coder->sequence = SEQ_PADDING;
  }
  else if (aVar1 != SEQ_PADDING) {
    if (aVar1 != SEQ_CHECK) {
      return LZMA_PROG_ERROR;
    }
    goto LAB_008edc72;
  }
  while ((coder->compressed_size & 3) != 0) {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    out[*out_pos] = '\0';
    *out_pos = *out_pos + 1;
    coder->compressed_size = coder->compressed_size + 1;
  }
  if (coder->block->check == LZMA_CHECK_NONE) {
    return LZMA_STREAM_END;
  }
  lzma_check_finish(&coder->check,coder->block->check);
  coder->sequence = SEQ_CHECK;
LAB_008edc72:
  uVar5 = lzma_check_size(coder->block->check);
  in_size_00 = (ulong)uVar5;
  lzma_bufcpy((uint8_t *)&coder->check,&coder->pos,in_size_00,out,out_pos,out_size);
  bVar6 = in_size_00 <= coder->pos;
  if (bVar6) {
    memcpy(coder->block->raw_check,&coder->check,in_size_00);
  }
  coder_local._4_4_ = (lzma_ret)bVar6;
  return coder_local._4_4_;
}

Assistant:

static lzma_ret
block_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	// Check that our amount of input stays in proper limits.
	if (LZMA_VLI_MAX - coder->uncompressed_size < in_size - *in_pos)
		return LZMA_DATA_ERROR;

	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		if (COMPRESSED_SIZE_MAX - coder->compressed_size < out_used)
			return LZMA_DATA_ERROR;

		coder->compressed_size += out_used;

		// No need to check for overflow because we have already
		// checked it at the beginning of this function.
		coder->uncompressed_size += in_used;

		lzma_check_update(&coder->check, coder->block->check,
				in + in_start, in_used);

		if (ret != LZMA_STREAM_END || action == LZMA_SYNC_FLUSH)
			return ret;

		assert(*in_pos == in_size);
		assert(action == LZMA_FINISH);

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Pad Compressed Data to a multiple of four bytes. We can
		// use coder->compressed_size for this since we don't need
		// it for anything else anymore.
		while (coder->compressed_size & 3) {
			if (*out_pos >= out_size)
				return LZMA_OK;

			out[*out_pos] = 0x00;
			++*out_pos;
			++coder->compressed_size;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		lzma_check_finish(&coder->check, coder->block->check);

		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(coder->check.buffer.u8, &coder->pos, check_size,
				out, out_pos, out_size);
		if (coder->pos < check_size)
			return LZMA_OK;

		memcpy(coder->block->raw_check, coder->check.buffer.u8,
				check_size);
		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}